

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_trinary_func_op_cast
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          uint32_t op2,char *op,BaseType input_type)

{
  bool bVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  undefined1 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd51;
  undefined1 in_stack_fffffffffffffd52;
  undefined1 in_stack_fffffffffffffd53;
  bool forwarding;
  undefined4 in_stack_fffffffffffffd54;
  string local_270;
  string local_250;
  string local_230 [32];
  undefined1 local_210 [8];
  string expr;
  string cast_op2;
  string cast_op1;
  undefined1 local_1a0 [8];
  string cast_op0;
  SPIRType expected_type;
  SPIRType *out_type;
  uint32_t op2_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  pSVar2 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,result_type);
  SPIRType::SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8),pSVar2);
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op0);
  if (pSVar3->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_((string *)local_1a0,this,op0,true);
  }
  else {
    bitcast_glsl_abi_cxx11_((string *)local_1a0,this,(SPIRType *)((long)&cast_op0.field_2 + 8),op0);
  }
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op1);
  if (pSVar3->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_((string *)((long)&cast_op2.field_2 + 8),this,op1,true);
  }
  else {
    bitcast_glsl_abi_cxx11_
              ((string *)((long)&cast_op2.field_2 + 8),this,
               (SPIRType *)((long)&cast_op0.field_2 + 8),op1);
  }
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op2);
  if (pSVar3->basetype == input_type) {
    to_unpacked_expression_abi_cxx11_((string *)((long)&expr.field_2 + 8),this,op2,true);
  }
  else {
    bitcast_glsl_abi_cxx11_
              ((string *)((long)&expr.field_2 + 8),this,(SPIRType *)((long)&cast_op0.field_2 + 8),
               op2);
  }
  ::std::__cxx11::string::string((string *)local_210);
  if (pSVar2->basetype == input_type) {
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_270,(spirv_cross *)&op,(char **)0x4a488c,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])((long)&cast_op2.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])((long)&expr.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])
               CONCAT44(in_stack_fffffffffffffd54,
                        CONCAT13(in_stack_fffffffffffffd53,
                                 CONCAT12(in_stack_fffffffffffffd52,
                                          CONCAT11(in_stack_fffffffffffffd51,
                                                   in_stack_fffffffffffffd50)))));
    ::std::__cxx11::string::operator+=((string *)local_210,(string *)&local_270);
    ::std::__cxx11::string::~string((string *)&local_270);
  }
  else {
    (*(this->super_Compiler)._vptr_Compiler[0x3b])
              (local_230,this,pSVar2,(undefined1 *)((long)&cast_op0.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)local_210,local_230);
    ::std::__cxx11::string::~string(local_230);
    ::std::__cxx11::string::operator+=((string *)local_210,'(');
    join<char_const*&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (&local_250,(spirv_cross *)&op,(char **)0x4a488c,(char (*) [2])local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])((long)&cast_op2.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a12ae,
               (char (*) [3])((long)&expr.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4b01ae,
               (char (*) [2])
               CONCAT44(in_stack_fffffffffffffd54,
                        CONCAT13(in_stack_fffffffffffffd53,
                                 CONCAT12(in_stack_fffffffffffffd52,
                                          CONCAT11(in_stack_fffffffffffffd51,
                                                   in_stack_fffffffffffffd50)))));
    ::std::__cxx11::string::operator+=((string *)local_210,(string *)&local_250);
    ::std::__cxx11::string::~string((string *)&local_250);
    ::std::__cxx11::string::operator+=((string *)local_210,')');
  }
  bVar1 = should_forward(this,op0);
  forwarding = false;
  if (bVar1) {
    bVar1 = should_forward(this,op1);
    forwarding = false;
    if (bVar1) {
      forwarding = should_forward(this,op2);
    }
  }
  emit_op(this,result_type,result_id,(string *)local_210,forwarding,false);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op0);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op1);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,result_id,op2);
  ::std::__cxx11::string::~string((string *)local_210);
  ::std::__cxx11::string::~string((string *)(expr.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(cast_op2.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)local_1a0);
  SPIRType::~SPIRType((SPIRType *)((long)&cast_op0.field_2 + 8));
  return;
}

Assistant:

void CompilerGLSL::emit_trinary_func_op_cast(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                             uint32_t op2, const char *op, SPIRType::BaseType input_type)
{
	auto &out_type = get<SPIRType>(result_type);
	auto expected_type = out_type;
	expected_type.basetype = input_type;
	string cast_op0 =
	    expression_type(op0).basetype != input_type ? bitcast_glsl(expected_type, op0) : to_unpacked_expression(op0);
	string cast_op1 =
	    expression_type(op1).basetype != input_type ? bitcast_glsl(expected_type, op1) : to_unpacked_expression(op1);
	string cast_op2 =
	    expression_type(op2).basetype != input_type ? bitcast_glsl(expected_type, op2) : to_unpacked_expression(op2);

	string expr;
	if (out_type.basetype != input_type)
	{
		expr = bitcast_glsl_op(out_type, expected_type);
		expr += '(';
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
		expr += ')';
	}
	else
	{
		expr += join(op, "(", cast_op0, ", ", cast_op1, ", ", cast_op2, ")");
	}

	emit_op(result_type, result_id, expr, should_forward(op0) && should_forward(op1) && should_forward(op2));
	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
	inherit_expression_dependencies(result_id, op2);
}